

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_CreateRawTransaction_Test::TestBody
          (cfdcapi_transaction_CreateRawTransaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  long *expected_predicate_value;
  void **in_stack_000000a8;
  char *in_stack_000000b0;
  uint32_t in_stack_000000bc;
  uint32_t in_stack_000000c0;
  int in_stack_000000c4;
  void *in_stack_000000c8;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  char *str_buffer;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *tx;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *in_stack_00000490;
  char *in_stack_00000498;
  char *in_stack_000004a0;
  int64_t in_stack_000004a8;
  void *in_stack_000004b0;
  void *in_stack_000004b8;
  bool *in_stack_fffffffffffffc18;
  AssertionResult *in_stack_fffffffffffffc20;
  CfdErrorCode *in_stack_fffffffffffffc28;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  void **in_stack_fffffffffffffc38;
  void *in_stack_fffffffffffffc58;
  char **in_stack_fffffffffffffcb0;
  AssertionResult *in_stack_fffffffffffffcb8;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  char *local_230;
  AssertHelper local_228;
  uint32_t in_stack_fffffffffffffde0;
  uint32_t in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  void *in_stack_fffffffffffffdf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  AssertHelper local_200;
  Message local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  char *local_1b8;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_d9;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffc38);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc38,
             (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b767a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3b76dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b7732);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,(type *)0x3b7766);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3b7862);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b78dd);
  local_a0 = 0;
  expected_predicate_value = &local_a0;
  local_14 = CfdInitializeTransaction
                       (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                        in_stack_000000b0,in_stack_000000a8);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc38,
             (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b79c1);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3b7a24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b7a79);
  local_d9 = local_a0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,(type *)0x3b7aad);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d8,(AssertionResult *)"(NULL == create_handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message((Message *)0x3b7ba9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b7c24);
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         (in_stack_fffffffffffffdf8.ptr_,in_stack_fffffffffffffdf0,
                          (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                          in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
    local_124 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b7d0a);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x33,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3b7d6d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b7dc2);
  }
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         (in_stack_fffffffffffffdf8.ptr_,in_stack_fffffffffffffdf0,
                          (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                          in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
    local_14c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b7ead);
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x39,pcVar2);
      testing::internal::AssertHelper::operator=(&local_160,&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      testing::Message::~Message((Message *)0x3b7f10);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b7f65);
  }
  if (local_14 == 0) {
    local_14 = CfdAddTransactionOutput
                         (in_stack_000004b8,in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,
                          in_stack_00000498,in_stack_00000490);
    local_174 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b8052);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x40,pcVar2);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      testing::Message::~Message((Message *)0x3b80b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b810a);
  }
  if (local_14 == 0) {
    local_14 = CfdAddTransactionOutput
                         (in_stack_000004b8,in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,
                          in_stack_00000498,in_stack_00000490);
    local_19c = 0;
    in_stack_fffffffffffffcb8 = &local_198;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffcb8);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      in_stack_fffffffffffffcb0 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3b81f7);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x47,(char *)in_stack_fffffffffffffcb0);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message((Message *)0x3b825a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b82af);
  }
  if (local_14 == 0) {
    local_1b8 = (char *)0x0;
    local_14 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,(char **)0x3b82fa);
    local_1cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b839c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      testing::Message::~Message((Message *)0x3b83ff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8454);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1f0,"exp_tx","tx",TestBody::exp_tx,local_1b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b84f7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x4f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x3b8554);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b85a9);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc28);
    }
  }
  local_14 = CfdFreeTransactionHandle(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc38,
             (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf0);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffde0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b8677);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&stack0xfffffffffffffde0);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x3b86d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b872c);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffc58);
  if (local_14 != 0) {
    local_230 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    local_244 = 0;
    pAVar3 = &local_240;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc38,
               (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b8817);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x5b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message((Message *)0x3b8874);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b88c9);
    testing::internal::CmpHelperSTREQ((internal *)&local_268,"\"\"","str_buffer","",local_230);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      in_stack_fffffffffffffc38 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3b895e);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x5c,(char *)in_stack_fffffffffffffc38);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message((Message *)0x3b89bb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8a10);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc28);
    local_230 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc28);
  local_28c = 0;
  pAVar3 = &local_288;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc38,
             (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3b8ae0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message((Message *)0x3b8b3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b8b92);
  return;
}

Assistant:

TEST(cfdcapi_transaction, CreateRawTransaction) {
  static const char* exp_tx = "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000";

  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(
      handle, kCfdNetworkMainnet, 1, 17, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));

  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
        handle, create_handle, "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
        4294967278);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
        handle, create_handle, "8ac60eb9575db5b2d987e29f301b5b819ea83a5c6579d282d189cc04b8e151ef", 1,
        0xffffffff);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionOutput(
        handle, create_handle, 112340000, "1Cu32FVupVCgHkMMRJdYJugxwo2Aprgk7H",
        nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionOutput(
        handle, create_handle, 223450000, "16TZ8J6Q5iZKBWizWzFAYnrsaox5Z5aBRV",
        nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    char* tx = nullptr;
    ret = CfdFinalizeTransaction(handle, create_handle, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_tx, tx);
      CfdFreeStringBuffer(tx);
    }
  }

  ret = CfdFreeTransactionHandle(handle, create_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}